

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int change_gfx_mode(void)

{
  ALLEGRO_EVENT_QUEUE *pAVar1;
  undefined8 uVar2;
  undefined8 in_XMM1_Qa;
  int flags;
  int ret;
  undefined4 local_c;
  undefined4 local_4;
  
  if (fullscreen == 0) {
    local_c = 0x11;
    screen_width = window_width;
    screen_height = window_height;
  }
  else if (fullscreen == 1) {
    local_c = 0x200;
  }
  else {
    local_c = 2;
  }
  if (screen != (ALLEGRO_DISPLAY *)0x0) {
    al_destroy_display(screen);
  }
  al_set_new_display_flags(local_c);
  if (screen_samples < 2) {
    al_set_new_display_option(0x11,0,2);
    al_set_new_display_option(0x12,0,2);
  }
  else {
    al_set_new_display_option(0x11,1,2);
    al_set_new_display_option(0x12,screen_samples,2);
  }
  al_set_new_display_option(0x20,10,2);
  screen = (ALLEGRO_DISPLAY *)al_create_display(screen_width,screen_height);
  if (screen == (ALLEGRO_DISPLAY *)0x0) {
    local_4 = 1;
  }
  else {
    al_set_window_constraints(screen,0x140,0x140,0);
    screen_width = al_get_display_width(screen);
    screen_height = al_get_display_height(screen);
    pAVar1 = event_queue;
    screen_orientation = 2;
    uVar2 = al_get_display_event_source(screen);
    al_register_event_source(pAVar1,uVar2);
    uVar2 = al_map_rgb(0,0);
    al_clear_to_color(uVar2,in_XMM1_Qa);
    local_4 = load_data();
    if (local_4 == 0) {
      init_background();
    }
  }
  return local_4;
}

Assistant:

int change_gfx_mode(void)
{
   int ret = DEMO_OK;
   int flags = 0;

   /* Select appropriate (fullscreen or windowed) gfx mode driver. */
   if (fullscreen == 0) {
      flags |= ALLEGRO_WINDOWED | ALLEGRO_RESIZABLE;
      screen_width = window_width;
      screen_height = window_height;
   } else if (fullscreen == 1) {
      flags |= ALLEGRO_FULLSCREEN_WINDOW;
   } else {
      flags |= ALLEGRO_FULLSCREEN;
   }
   
   if (screen) {
      al_destroy_display(screen);
   }

   al_set_new_display_flags(flags);
   
   // May be a good idea, but need to add a border to textures for it.
   // al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR);
   
   if (screen_samples > 1) {
      al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
      al_set_new_display_option(ALLEGRO_SAMPLES, screen_samples, ALLEGRO_SUGGEST);
   }
   else {
      al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 0, ALLEGRO_SUGGEST);
      al_set_new_display_option(ALLEGRO_SAMPLES, 0, ALLEGRO_SUGGEST);
   }
   
   al_set_new_display_option(ALLEGRO_SUPPORTED_ORIENTATIONS,
                             ALLEGRO_DISPLAY_ORIENTATION_LANDSCAPE, ALLEGRO_SUGGEST);

   /* Attempt to set the selected colour depth and gfx mode. */
   screen = al_create_display(screen_width, screen_height);
   if (!screen) {
      return DEMO_ERROR_ALLEGRO;
   }
   al_set_window_constraints(screen, 320, 320, 0, 0);
   
   screen_width = al_get_display_width(screen);
   screen_height = al_get_display_height(screen);
   screen_orientation = ALLEGRO_DISPLAY_ORIENTATION_90_DEGREES;
   
   al_register_event_source(event_queue, al_get_display_event_source(screen));

   /* blank display now, before doing any more complicated stuff */
   al_clear_to_color(al_map_rgb(0, 0, 0));

   /* Attempt to load game data. */
   ret = load_data();

   /* If loading was successful, initialize the background scroller module. */
   if (ret == DEMO_OK) {
      init_background();
   }

   return ret;
}